

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O2

_Bool options_save_custom(player_options *opts,int page)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  char *pcVar4;
  ang_file *f;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  int *piVar8;
  char file_name [80];
  char path [1024];
  
  pcVar4 = option_type_name(page);
  _Var1 = false;
  strnfmt(file_name,0x50,"customized_%s_options.txt",pcVar4);
  path_build(path,0x400,ANGBAND_DIR_USER,file_name);
  f = file_open(path,MODE_WRITE,FTYPE_TEXT);
  if (f != (ang_file *)0x0) {
    _Var1 = file_putf(f,"# These are customized defaults for the %s options.\n",pcVar4);
    _Var2 = file_put(f,"# All lines begin with \"option:\" followed by the internal option name.\n")
    ;
    _Var3 = file_put(f,
                     "# After the name is a colon followed by yes or no for the option\'s state.\n")
    ;
    bVar7 = (_Var3 && _Var2) && _Var1;
    piVar8 = &options[0].type;
    for (lVar6 = 0; lVar6 != 0x2c; lVar6 = lVar6 + 1) {
      if (*piVar8 == page) {
        pcVar4 = ((option_entry *)(piVar8 + -4))->name;
        _Var1 = file_putf(f,"# %s\n",*(char **)(piVar8 + -2));
        pcVar5 = "no";
        if (opts->opt[lVar6] != false) {
          pcVar5 = "yes";
        }
        _Var2 = file_putf(f,"option:%s:%s\n",pcVar4,pcVar5);
        bVar7 = (bool)(_Var1 & bVar7 & _Var2);
      }
      piVar8 = piVar8 + 6;
    }
    _Var1 = file_close(f);
    _Var1 = (_Bool)(_Var1 & bVar7);
  }
  return _Var1;
}

Assistant:

bool options_save_custom(struct player_options *opts, int page)
{
	const char *page_name = option_type_name(page);
	bool success = true;
	char path[1024], file_name[80];
	ang_file *f;

	strnfmt(file_name, sizeof(file_name), "customized_%s_options.txt",
		page_name);
	path_build(path, sizeof(path), ANGBAND_DIR_USER, file_name);
	f = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (f) {
		int opt;

		if (!file_putf(f, "# These are customized defaults for the %s options.\n", page_name)) {
			success = false;
		}
		if (!file_put(f, "# All lines begin with \"option:\" followed by the internal option name.\n")) {
			success = false;
		}
		if (!file_put(f, "# After the name is a colon followed by yes or no for the option's state.\n")) {
			success = false;
		}
		for (opt = 0; opt < OPT_MAX; opt++) {
			if (options[opt].type == page) {
				if (!file_putf(f, "# %s\n",
						 options[opt].description)) {
					success = false;
				}
				if (!file_putf(f, "option:%s:%s\n",
						options[opt].name,
						((*opts).opt[opt]) ? "yes" : "no")) {
					success = false;
				}
			}
		}

		if (!file_close(f)) {
			success = false;
		}
	} else {
		success = false;
	}
	return success;
}